

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_copy_key_material(psa_key_slot_t *source,psa_key_slot_t *target)

{
  ushort uVar1;
  psa_status_t pVar2;
  uint8_t *data;
  size_t __size;
  size_t length;
  size_t local_30;
  
  uVar1 = (source->attr).type;
  if (((uVar1 & 0x7000) != 0x2000) && ((uVar1 & 0x7000) != 0x1000)) {
    if (uVar1 < 0x7001) {
      if (uVar1 == 0x4001) {
        __size = (ulong)((source->attr).bits >> 3) + 0x10;
        goto LAB_001119c4;
      }
      if (uVar1 == 0x4002) {
        __size = (ulong)((source->attr).bits >> 3) * 3 + 0x4a;
        goto LAB_001119c4;
      }
    }
    else {
      if (uVar1 == 0x7002) {
        __size = (ulong)((source->attr).bits >> 3) * 3 + 0x5a;
        goto LAB_001119c4;
      }
      if (uVar1 == 0x7001) {
        __size = (ulong)(((source->attr).bits >> 1) + 1 >> 3) * 9 + 0x3b;
        goto LAB_001119c4;
      }
    }
    if ((uVar1 & 0xff00) == 0x4100) {
      __size = (ulong)((source->attr).bits + 7 >> 2) | 1;
      goto LAB_001119c4;
    }
    if ((uVar1 & 0xff00) != 0x7100) {
      __size = 0;
      goto LAB_001119c4;
    }
  }
  __size = (size_t)((source->attr).bits + 7 >> 3);
LAB_001119c4:
  data = (uint8_t *)calloc(1,__size);
  if (data == (uint8_t *)0x0) {
    pVar2 = -0x8d;
  }
  else {
    pVar2 = psa_internal_export_key(source,data,__size,&local_30,0);
    if (pVar2 == 0) {
      (target->attr).type = (source->attr).type;
      pVar2 = psa_import_key_into_slot(target,data,local_30);
    }
    mbedtls_platform_zeroize(data,__size);
    free(data);
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_copy_key_material( const psa_key_slot_t *source,
                                           psa_key_slot_t *target )
{
    psa_status_t status;
    uint8_t *buffer = NULL;
    size_t buffer_size = 0;
    size_t length;

    buffer_size = PSA_KEY_EXPORT_MAX_SIZE( source->attr.type,
                                           psa_get_key_slot_bits( source ) );
    buffer = mbedtls_calloc( 1, buffer_size );
    if( buffer == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );
    status = psa_internal_export_key( source, buffer, buffer_size, &length, 0 );
    if( status != PSA_SUCCESS )
        goto exit;
    target->attr.type = source->attr.type;
    status = psa_import_key_into_slot( target, buffer, length );

exit:
    mbedtls_platform_zeroize( buffer, buffer_size );
    mbedtls_free( buffer );
    return( status );
}